

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_row.cpp
# Opt level: O0

iterator * __thiscall csv::CSVRow::iterator::operator--(iterator *this)

{
  CSVField local_58;
  iterator *local_10;
  iterator *this_local;
  
  this->i = this->i + -1;
  local_10 = this;
  CSVRow::operator[](&local_58,this->daddy,(long)this->i);
  std::make_shared<csv::CSVField,csv::CSVField>((CSVField *)&stack0xffffffffffffffe0);
  std::shared_ptr<csv::CSVField>::operator=
            (&this->field,(shared_ptr<csv::CSVField> *)&stack0xffffffffffffffe0);
  std::shared_ptr<csv::CSVField>::~shared_ptr((shared_ptr<csv::CSVField> *)&stack0xffffffffffffffe0)
  ;
  return this;
}

Assistant:

CSV_INLINE CSVRow::iterator& CSVRow::iterator::operator--() {
        // Pre-decrement operator
        this->i--;
        this->field = std::make_shared<CSVField>(
            this->daddy->operator[](this->i));
        return *this;
    }